

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O1

long __thiscall
boost::asio::detail::
timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::wait_duration_msec
          (timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,long max_duration)

{
  pointer t1;
  duration_type dVar1;
  ulong uVar2;
  time_type local_18;
  
  t1 = (this->heap_).
       super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (t1 != (this->heap_).
            super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
    local_18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    dVar1 = chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>
            ::subtract(&t1->time_,&local_18);
    if (dVar1.__r < 1) {
      max_duration = 0;
    }
    else {
      uVar2 = (ulong)dVar1.__r / 1000000;
      if (max_duration <= (long)((ulong)dVar1.__r / 1000000)) {
        uVar2 = max_duration;
      }
      max_duration = 1;
      if (999999 < (ulong)dVar1.__r) {
        max_duration = uVar2;
      }
    }
  }
  return max_duration;
}

Assistant:

virtual long wait_duration_msec(long max_duration) const
  {
    if (heap_.empty())
      return max_duration;

    return this->to_msec(
        Time_Traits::to_posix_duration(
          Time_Traits::subtract(heap_[0].time_, Time_Traits::now())),
        max_duration);
  }